

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

OutRec * ClipperLib::GetLowermostRec(OutRec *outRec1,OutRec *outRec2)

{
  OutPt *btmPt1;
  OutPt *btmPt2;
  long lVar1;
  long lVar2;
  bool bVar3;
  OutRec *pOVar4;
  
  btmPt1 = outRec1->bottomPt;
  btmPt2 = outRec2->bottomPt;
  lVar1 = (btmPt2->pt).Y;
  lVar2 = (btmPt1->pt).Y;
  pOVar4 = outRec1;
  if ((lVar2 <= lVar1) && (pOVar4 = outRec2, lVar1 <= lVar2)) {
    lVar1 = (btmPt2->pt).X;
    lVar2 = (btmPt1->pt).X;
    pOVar4 = outRec1;
    if (((lVar1 <= lVar2) &&
        (((pOVar4 = outRec2, lVar2 <= lVar1 && (btmPt1->next != btmPt1)) &&
         (pOVar4 = outRec1, btmPt2->next != btmPt2)))) &&
       (bVar3 = FirstIsBottomPt(btmPt1,btmPt2), !bVar3)) {
      pOVar4 = outRec2;
    }
  }
  return pOVar4;
}

Assistant:

OutRec* GetLowermostRec(OutRec *outRec1, OutRec *outRec2)
{
  //work out which polygon fragment has the correct hole state ...
  OutPt *outPt1 = outRec1->bottomPt;
  OutPt *outPt2 = outRec2->bottomPt;
  if (outPt1->pt.Y > outPt2->pt.Y) return outRec1;
  else if (outPt1->pt.Y < outPt2->pt.Y) return outRec2;
  else if (outPt1->pt.X < outPt2->pt.X) return outRec1;
  else if (outPt1->pt.X > outPt2->pt.X) return outRec2;
  else if (outPt1->next == outPt1) return outRec2;
  else if (outPt2->next == outPt2) return outRec1;
  else if (FirstIsBottomPt(outPt1, outPt2)) return outRec1;
  else return outRec2;
}